

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

YieldResult * __thiscall
NEST::NESTcalc::GetYieldERWeighted
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,vector<double,_std::allocator<double>_> *ERYieldsParam,
          vector<double,_std::allocator<double>_> *EnergyParams,
          vector<double,_std::allocator<double>_> *FieldParams)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  Wvalue WVar4;
  YieldResult result;
  YieldResult yieldsG;
  YieldResult yieldsB;
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  WVar4 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
  (*this->_vptr_NESTcalc[10])
            (energy,SUB84(density,0),dfield,0x3ff0000000000000,local_60,this,ERYieldsParam);
  (*this->_vptr_NESTcalc[2])(energy,SUB84(density,0),dfield,0x3ff0000000000000,local_90,this);
  dVar1 = (EnergyParams->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[2];
  dVar3 = log(energy);
  erf((dVar3 + (EnergyParams->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[3]) * dVar1);
  pdVar2 = (FieldParams->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pow(dfield / *pdVar2,pdVar2[1]);
  (*this->_vptr_NESTcalc[0xb])(energy,WVar4.Wq_eV._0_4_,__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldERWeighted(
    double energy, double density, double dfield,
    const std::vector<double> &ERYieldsParam,
    const std::vector<double> &EnergyParams,
    const std::vector<double> &FieldParams) {
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;

  YieldResult yieldsB = GetYieldBetaGR(energy, density, dfield, ERYieldsParam);
  YieldResult yieldsG = GetYieldGamma(energy, density, dfield);
  double weightG =
      EnergyParams[0] +
      EnergyParams[1] * erf(EnergyParams[2] * (log(energy) + EnergyParams[3])) *
          (1. - (1. / (1. + pow(dfield / FieldParams[0], FieldParams[1]))));
  // field weighting added to match dependence reported by XELDA and LUX Run3.
  // Not validated beyond of fields on the order of a few hundred V/cm
  double weightB = 1. - weightG;

  YieldResult result{};
  result.PhotonYield =
      weightG * yieldsG.PhotonYield + weightB * yieldsB.PhotonYield;
  result.ElectronYield =
      weightG * yieldsG.ElectronYield + weightB * yieldsB.ElectronYield;
  result.ExcitonRatio =
      weightG * yieldsG.ExcitonRatio + weightB * yieldsB.ExcitonRatio;
  result.Lindhard = weightG * yieldsG.Lindhard + weightB * yieldsB.Lindhard;
  result.ElectricField =
      weightG * yieldsG.ElectricField + weightB * yieldsB.ElectricField;
  result.DeltaT_Scint =
      weightG * yieldsG.DeltaT_Scint + weightB * yieldsB.DeltaT_Scint;
  return YieldResultValidity(result, energy, Wq_eV);
}